

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptErrors.h
# Opt level: O2

void __thiscall
MiniScript::TooManyArgumentsException::TooManyArgumentsException
          (TooManyArgumentsException *this,String *msg)

{
  String local_20;
  
  String::String(&local_20,msg);
  RuntimeException::RuntimeException(&this->super_RuntimeException,&local_20);
  String::~String(&local_20);
  *(undefined ***)&(this->super_RuntimeException).super_MiniscriptException =
       &PTR__MiniscriptException_001669c8;
  return;
}

Assistant:

TooManyArgumentsException(String msg="Too Many Arguments") : RuntimeException(msg) {}